

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filefind.cpp
# Opt level: O0

bool __thiscall Am_Filename::Exists(Am_Filename *this)

{
  int iVar1;
  char *__file;
  int *piVar2;
  ostream *this_00;
  undefined1 local_a8 [4];
  int res;
  stat buf;
  Am_Filename *this_local;
  
  buf.__glibc_reserved[2] = (__syscall_slong_t)this;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_a8);
  if (iVar1 == 0) {
    this_local._7_1_ = true;
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == 2) {
      this_local._7_1_ = false;
    }
    else {
      this_00 = std::operator<<((ostream *)&std::cout,"Unknown error in stat() !");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
Am_Filename::Exists() const
{
#ifdef _WIN32
  bool res = true;
  // We need a place to store the information on the file
  WIN32_FIND_DATA *mEntryInformation = new WIN32_FIND_DATA;
  // and we get the information; handle to work with Win32 directory functions
  HANDLE mDirectoryIterator =
      FindFirstFile(filename.c_str(), mEntryInformation);
  if (mDirectoryIterator == INVALID_HANDLE_VALUE) {
    // if it was a file-not-found:
    if (GetLastError() == ERROR_FILE_NOT_FOUND) {
      res = false;
    } else {
      std::cout << "Unknown error in FindFirstFile() !" << std::endl;
      res = false;
    }
  } else {
    // Release the allocated resource
    FindClose(mDirectoryIterator);
  }
  delete mEntryInformation;
  return res;
#else
  struct stat buf;
  int res = stat(filename.c_str(), &buf); // UNIX-specific
  if (res != 0) {
    if (errno == ENOENT)
      return false;
    std::cout << "Unknown error in stat() !" << std::endl;
    return false; // Just to be conservative
  }
  return true;
#endif
}